

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O2

predictor * __thiscall
Search::predictor::add_to<unsigned_int>
          (predictor *this,v_array<unsigned_int> *A,bool *A_is_ptr,uint a,bool clear_first)

{
  size_t new_size;
  uint a_local;
  
  a_local = a;
  if (*A_is_ptr == true) {
    if (clear_first) {
      A->_end = A->_begin;
      new_size = 1;
    }
    else {
      new_size = ((long)A->_end - (long)A->_begin >> 2) + 1;
    }
    make_new_pointer<unsigned_int>(this,A,new_size);
    *A_is_ptr = false;
    A->_begin[new_size - 1] = a;
  }
  else {
    if (clear_first) {
      v_array<unsigned_int>::clear(A);
    }
    v_array<unsigned_int>::push_back(A,&a_local);
  }
  return this;
}

Assistant:

predictor& predictor::add_to(v_array<T>& A, bool& A_is_ptr, T a, bool clear_first)
{
  if (A_is_ptr)  // we need to make our own memory
  {
    if (clear_first)
      A.end() = A.begin();
    size_t new_size = clear_first ? 1 : (A.size() + 1);
    make_new_pointer<T>(A, new_size);
    A_is_ptr = false;
    A[new_size - 1] = a;
  }
  else  // we've already allocated our own memory
  {
    if (clear_first)
      A.clear();
    A.push_back(a);
  }
  return *this;
}